

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

void remove_link_endpoint(LINK_ENDPOINT_HANDLE link_endpoint)

{
  SESSION_HANDLE pSVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  LINK_ENDPOINT_INSTANCE **ppLVar6;
  ulong uVar7;
  bool bVar8;
  
  pSVar1 = link_endpoint->session;
  uVar4 = pSVar1->link_endpoint_count;
  bVar8 = uVar4 != 0;
  if (bVar8) {
    if (*pSVar1->link_endpoints == link_endpoint) {
      uVar5 = 0;
    }
    else {
      uVar7 = 0;
      do {
        if (uVar4 - 1 == (int)uVar7) {
          return;
        }
        uVar5 = uVar7 + 1;
        lVar2 = uVar7 + 1;
        uVar7 = uVar5;
      } while (pSVar1->link_endpoints[lVar2] != link_endpoint);
      bVar8 = (uint)uVar5 < uVar4;
    }
    if (bVar8) {
      uVar3 = (uint)uVar5;
      if (uVar3 < uVar4 - 1) {
        memmove(pSVar1->link_endpoints + (uVar5 & 0xffffffff),pSVar1->link_endpoints + (uVar3 + 1),
                (ulong)(uVar4 + ~uVar3) << 3);
      }
      uVar4 = pSVar1->link_endpoint_count - 1;
      pSVar1->link_endpoint_count = uVar4;
      if (uVar4 == 0) {
        free(pSVar1->link_endpoints);
        pSVar1->link_endpoints = (LINK_ENDPOINT_INSTANCE **)0x0;
      }
      else {
        ppLVar6 = (LINK_ENDPOINT_INSTANCE **)realloc(pSVar1->link_endpoints,(ulong)uVar4 << 3);
        if (ppLVar6 != (LINK_ENDPOINT_INSTANCE **)0x0) {
          pSVar1->link_endpoints = ppLVar6;
        }
      }
    }
  }
  return;
}

Assistant:

static void remove_link_endpoint(LINK_ENDPOINT_HANDLE link_endpoint)
{
    if (link_endpoint != NULL)
    {
        LINK_ENDPOINT_INSTANCE* endpoint_instance = (LINK_ENDPOINT_INSTANCE*)link_endpoint;
        SESSION_INSTANCE* session_instance = endpoint_instance->session;
        uint32_t i;

        for (i = 0; i < session_instance->link_endpoint_count; i++)
        {
            if (session_instance->link_endpoints[i] == link_endpoint)
            {
                break;
            }
        }

        if (i < session_instance->link_endpoint_count)
        {
            LINK_ENDPOINT_INSTANCE** new_endpoints;

            if (i < (session_instance->link_endpoint_count - 1))
            {
                (void)memmove(&session_instance->link_endpoints[i], &session_instance->link_endpoints[i + 1], (session_instance->link_endpoint_count - (uint32_t)i - 1) * sizeof(LINK_ENDPOINT_INSTANCE*));
            }

            session_instance->link_endpoint_count--;

            if (session_instance->link_endpoint_count == 0)
            {
                free(session_instance->link_endpoints);
                session_instance->link_endpoints = NULL;
            }
            else
            {
                size_t realloc_size = safe_multiply_size_t(sizeof(LINK_ENDPOINT_INSTANCE*), session_instance->link_endpoint_count);
                if (realloc_size != SIZE_MAX &&
                    (new_endpoints = (LINK_ENDPOINT_INSTANCE**)realloc(session_instance->link_endpoints, realloc_size)) != NULL)
                {
                    session_instance->link_endpoints = new_endpoints;
                }
            }
        }
    }
}